

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

vector<Range,_std::allocator<Range>_> *
getAllExclusions(vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,Rules *rules,
                Range *range)

{
  size_type sVar1;
  pointer pEVar2;
  bool bVar3;
  Exclusion *exclusion;
  pointer pEVar4;
  pointer pRVar5;
  Range *r;
  pointer pRVar6;
  _Alloc_hider this;
  Exclusion *exclusion_1;
  allocator<char> local_119;
  vector<Range,_std::allocator<Range>_> exclusionRanges;
  string local_f0;
  Range *local_d0;
  vector<Range,_std::allocator<Range>_> daysOff;
  vector<Exclusion,_std::allocator<Exclusion>_> exclusions;
  vector<Range,_std::allocator<Range>_> results;
  vector<Range,_std::allocator<Range>_> daysOn;
  
  results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  results.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getHolidays((vector<Range,_std::allocator<Range>_> *)&local_f0,rules);
  local_d0 = range;
  addRanges(&exclusionRanges,range,&results,(vector<Range,_std::allocator<Range>_> *)&local_f0);
  std::vector<Range,_std::allocator<Range>_>::_M_move_assign(&results,&exclusionRanges);
  std::vector<Range,_std::allocator<Range>_>::~vector(&exclusionRanges);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)&local_f0);
  exclusions.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  exclusions.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  exclusions.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&exclusionRanges,"exclusions.",(allocator<char> *)&local_f0);
  Rules::all((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&daysOff,rules,(string *)&exclusionRanges);
  std::__cxx11::string::~string((string *)&exclusionRanges);
  for (pRVar5 = daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar5 != daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                super__Vector_impl_data._M_finish; pRVar5 = (pointer)&(pRVar5->start)._seconds) {
    lowerCase((string *)&exclusionRanges,(string *)pRVar5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&daysOn,"",&local_119);
    Rules::get(&local_f0,rules,(string *)pRVar5,(string *)&daysOn);
    std::vector<Exclusion,std::allocator<Exclusion>>::
    emplace_back<std::__cxx11::string,std::__cxx11::string>
              ((vector<Exclusion,std::allocator<Exclusion>> *)&exclusions,(string *)&exclusionRanges
               ,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&daysOn);
    std::__cxx11::string::~string((string *)&exclusionRanges);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&daysOff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"Found {1} exclusions",(allocator<char> *)&daysOn);
  format<unsigned_long>
            ((string *)&exclusionRanges,&local_f0,
             (long)exclusions.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)exclusions.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5);
  debug((string *)&exclusionRanges);
  std::__cxx11::string::~string((string *)&exclusionRanges);
  std::__cxx11::string::~string((string *)&local_f0);
  pEVar2 = exclusions.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
           super__Vector_impl_data._M_finish;
  daysOn.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  daysOn.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  daysOn.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (pEVar4 = exclusions.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar4 != pEVar2; pEVar4 = pEVar4 + 1) {
    Exclusion::tokens_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&exclusionRanges,pEVar4);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &((exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>.
                               _M_impl.super__Vector_impl_data._M_start)->start)._seconds,"day");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&exclusionRanges);
    if (bVar3) {
      bVar3 = Exclusion::additive(pEVar4);
      if (bVar3) {
        Exclusion::ranges(&exclusionRanges,pEVar4,local_d0);
        pRVar5 = exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pRVar6 = exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                      super__Vector_impl_data._M_start; pRVar6 != pRVar5; pRVar6 = pRVar6 + 1) {
          std::vector<Range,_std::allocator<Range>_>::push_back(&daysOn,pRVar6);
        }
      }
      else {
        Exclusion::ranges(&exclusionRanges,pEVar4,local_d0);
        pRVar5 = exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pRVar6 = exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                      super__Vector_impl_data._M_start; pRVar6 != pRVar5; pRVar6 = pRVar6 + 1) {
          std::vector<Range,_std::allocator<Range>_>::push_back(&daysOff,pRVar6);
        }
      }
      std::vector<Range,_std::allocator<Range>_>::~vector(&exclusionRanges);
    }
  }
  addRanges(&exclusionRanges,local_d0,&results,&daysOff);
  std::vector<Range,_std::allocator<Range>_>::_M_move_assign(&results,&exclusionRanges);
  std::vector<Range,_std::allocator<Range>_>::~vector(&exclusionRanges);
  if (daysOn.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      daysOn.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"Found {1} additional working days",&local_119);
    format<unsigned_long>
              ((string *)&exclusionRanges,&local_f0,
               ((long)daysOn.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)daysOn.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x68);
    debug((string *)&exclusionRanges);
    std::__cxx11::string::~string((string *)&exclusionRanges);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  if (daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"Found {1} additional non-working days",&local_119);
    format<unsigned_long>
              ((string *)&exclusionRanges,&local_f0,
               ((long)daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)daysOff.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x68);
    debug((string *)&exclusionRanges);
    std::__cxx11::string::~string((string *)&exclusionRanges);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  subtractRanges(&exclusionRanges,&results,&daysOn);
  std::vector<Range,_std::allocator<Range>_>::_M_move_assign(&results,&exclusionRanges);
  std::vector<Range,_std::allocator<Range>_>::~vector(&exclusionRanges);
  pEVar2 = exclusions.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
           super__Vector_impl_data._M_finish;
  exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  exclusionRanges.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (pEVar4 = exclusions.super__Vector_base<Exclusion,_std::allocator<Exclusion>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar4 != pEVar2; pEVar4 = pEVar4 + 1) {
    Exclusion::tokens_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f0,pEVar4);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_f0._M_dataplus._M_p + 0x20),"day");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f0);
    if (bVar3) {
      Exclusion::ranges((vector<Range,_std::allocator<Range>_> *)&local_f0,pEVar4,local_d0);
      sVar1 = local_f0._M_string_length;
      for (this._M_p = local_f0._M_dataplus._M_p; this._M_p != (pointer)sVar1;
          this._M_p = this._M_p + 0x68) {
        bVar3 = Range::is_empty((Range *)this._M_p);
        if (!bVar3) {
          std::vector<Range,_std::allocator<Range>_>::push_back
                    (&exclusionRanges,(value_type *)this._M_p);
        }
      }
      std::vector<Range,_std::allocator<Range>_>::~vector
                ((vector<Range,_std::allocator<Range>_> *)&local_f0);
    }
  }
  addRanges((vector<Range,_std::allocator<Range>_> *)&local_f0,local_d0,&results,&exclusionRanges);
  merge(__return_storage_ptr__,(vector<Range,_std::allocator<Range>_> *)&local_f0);
  std::vector<Range,_std::allocator<Range>_>::~vector
            ((vector<Range,_std::allocator<Range>_> *)&local_f0);
  std::vector<Range,_std::allocator<Range>_>::~vector(&exclusionRanges);
  std::vector<Range,_std::allocator<Range>_>::~vector(&daysOff);
  std::vector<Range,_std::allocator<Range>_>::~vector(&daysOn);
  std::vector<Exclusion,_std::allocator<Exclusion>_>::~vector(&exclusions);
  std::vector<Range,_std::allocator<Range>_>::~vector(&results);
  return __return_storage_ptr__;
}

Assistant:

std::vector <Range> getAllExclusions (
  const Rules& rules,
  const Range& range)
{
  // Start with the set of all holidays, intersected with range.
  std::vector <Range> results;
  results = addRanges (range, results, getHolidays (rules));

  // Load all exclusions from configuration.
  std::vector <Exclusion> exclusions;
  for (auto& name : rules.all ("exclusions."))
    exclusions.emplace_back (lowerCase (name), rules.get (name));
  debug (format ("Found {1} exclusions", exclusions.size ()));

  // Find exclusions 'exc day on <date>' and remove from holidays.
  // Find exclusions 'exc day off <date>' and add to holidays.
  std::vector <Range> daysOn;
  std::vector <Range> daysOff;
  for (auto& exclusion : exclusions)
  {
    if (exclusion.tokens ()[1] == "day")
    {
      if (exclusion.additive ())
        for (auto& r : exclusion.ranges (range))
          daysOn.push_back (r);
      else
        for (auto& r : exclusion.ranges (range))
          daysOff.push_back (r);
    }
  }

  // daysOff are combined with existing holidays.
  results = addRanges (range, results, daysOff);
  if (! daysOn.empty ())
    debug (format ("Found {1} additional working days", daysOn.size ()));
  if (! daysOff.empty ())
    debug (format ("Found {1} additional non-working days", daysOff.size ()));

  // daysOn are subtracted from the existing holidays.
  results = subtractRanges (results, daysOn);

  // Expand all exclusions that are not 'exc day ...' into excluded ranges that
  // overlap with range.
  std::vector <Range> exclusionRanges;
  for (auto& exclusion : exclusions)
  {
    if (exclusion.tokens ()[1] != "day")
    {
      for (auto& r : exclusion.ranges (range))
      {
        if (! r.is_empty ())
        {
          exclusionRanges.push_back (r);
        }
      }
    }
  }

  return merge (addRanges (range, results, exclusionRanges));
}